

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::parser::check_token(parser *this)

{
  token *this_00;
  bool bVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  token_type t;
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  wstring local_1c8;
  source_extend local_1a8;
  wostringstream _oss;
  
  this_00 = &this->current_token_;
  token::operator=(this_00,&(this->lexer_).current_token_);
  bVar1 = is_reserved((this->current_token_).type_,this->version_);
  if (bVar1) {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
    pwVar2 = mjs::operator<<((wostream *)&_oss,this_00->type_);
    pwVar2 = std::operator<<(pwVar2," is reserved in ");
    mjs::operator<<(pwVar2,this->version_);
    current_extend(&local_1a8,this);
    std::__cxx11::wstringbuf::str();
    message._M_str = in_R9;
    message._M_len = (size_t)local_1c8._M_dataplus._M_p;
    syntax_error((parser *)"check_token",(char *)0x160,(int)&local_1a8,
                 (source_extend *)local_1c8._M_string_length,message);
  }
  if (1 < (int)this->version_) {
    bVar1 = find_token<9ul>(this_00->type_,(token_type (*) [9])es5_strict_reserved_tokens);
    if (bVar1) {
      if (this->strict_mode_ == true) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
        pwVar2 = mjs::operator<<((wostream *)&_oss,this_00->type_);
        pwVar2 = std::operator<<(pwVar2," is reserved in ");
        pbVar3 = mjs::operator<<(pwVar2,this->version_);
        std::operator<<(pbVar3," strict mode");
        current_extend(&local_1a8,this);
        std::__cxx11::wstringbuf::str();
        message_00._M_str = in_R9;
        message_00._M_len = (size_t)local_1c8._M_dataplus._M_p;
        syntax_error((parser *)"check_token",(char *)0x163,(int)&local_1a8,
                     (source_extend *)local_1c8._M_string_length,message_00);
      }
      token_string_abi_cxx11_(&local_1c8,(mjs *)(ulong)this_00->type_,t);
      token::token((token *)&_oss,identifier,&local_1c8);
      token::operator=(this_00,(token *)&_oss);
      token::destroy((token *)&_oss);
      std::__cxx11::wstring::~wstring((wstring *)&local_1c8);
    }
  }
  return;
}

Assistant:

void check_token() {
        current_token_ = lexer_.current_token();
        if (is_reserved(current_token_type(), version_)) {
            SYNTAX_ERROR(current_token_type() << " is reserved in " << version_);
        } else if (version_ >= version::es5 && find_token(current_token_type(), es5_strict_reserved_tokens)) {
            if (strict_mode_) {
                SYNTAX_ERROR(current_token_type() << " is reserved in " << version_ << " strict mode");
            }
            current_token_ = token{token_type::identifier, token_string(current_token_type())};
        }
    }